

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_mesh_tasks(CompilerHLSL *this,SPIRBlock *block)

{
  runtime_error *this_00;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((block->mesh).payload.id != 0) {
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_a0,&this->super_CompilerGLSL,(block->mesh).groups[0].id,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_80,&this->super_CompilerGLSL,(block->mesh).groups[1].id,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_40,&this->super_CompilerGLSL,(block->mesh).groups[2].id,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_60,&this->super_CompilerGLSL,(block->mesh).payload.id,true);
    CompilerGLSL::
    statement<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [14])"DispatchMesh(",&local_a0,
               (char (*) [3])0x37aab7,&local_80,(char (*) [3])0x37aab7,&local_40,
               (char (*) [3])0x37aab7,&local_60,(char (*) [3])0x365573);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"Amplification shader in HLSL must have payload","");
  ::std::runtime_error::runtime_error(this_00,(string *)&local_a0);
  *(undefined ***)this_00 = &PTR__runtime_error_003fce08;
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerHLSL::emit_mesh_tasks(SPIRBlock &block)
{
	if (block.mesh.payload != 0)
	{
		statement("DispatchMesh(", to_unpacked_expression(block.mesh.groups[0]), ", ", to_unpacked_expression(block.mesh.groups[1]), ", ",
		    to_unpacked_expression(block.mesh.groups[2]), ", ", to_unpacked_expression(block.mesh.payload), ");");
	}
	else
	{
		SPIRV_CROSS_THROW("Amplification shader in HLSL must have payload");
	}
}